

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,double v)

{
  int iVar1;
  char *__s;
  int len;
  double v_local;
  LogStream *this_local;
  
  iVar1 = FixedBuffer<4000>::avail(&this->buffer_);
  if (0x1f < iVar1) {
    __s = FixedBuffer<4000>::current(&this->buffer_);
    iVar1 = snprintf(__s,0x20,"%.12g",v);
    FixedBuffer<4000>::add(&this->buffer_,(long)iVar1);
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(double v) {
    if (buffer_.avail() >= kMaxNumericSize) {
        int len = snprintf(buffer_.current(), kMaxNumericSize, "%.12g", v);
        buffer_.add(len);
    }
    return *this;
}